

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_func)

{
  internals *piVar1;
  char cVar2;
  char *c;
  handle property;
  object local_90;
  object local_88;
  handle local_80;
  object local_78;
  object local_70;
  handle local_68;
  handle local_60;
  handle local_58 [2];
  PyObject *local_48;
  char *local_40;
  object local_38;
  
  if (rec_func == (function_record *)0x0) {
    local_58[0].m_ptr = (PyObject *)&PyProperty_Type;
    cVar2 = '\0';
  }
  else {
    cVar2 = options::global_state()::instance;
    if ((rec_func->field_0x59 & 0x40) == 0) {
      if (rec_func->doc == (char *)0x0) {
        cVar2 = '\0';
      }
    }
    else {
      if (rec_func->doc == (char *)0x0) {
        cVar2 = '\0';
      }
      if ((rec_func->scope).m_ptr != (PyObject *)0x0) {
        local_58[0].m_ptr = (PyObject *)&PyProperty_Type;
        goto LAB_00125980;
      }
    }
    piVar1 = get_internals();
    local_58[0].m_ptr = (PyObject *)piVar1->static_property_type;
  }
LAB_00125980:
  local_60.m_ptr = fget.m_ptr;
  if (fget.m_ptr == (PyObject *)0x0) {
    local_70.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
  }
  local_68.m_ptr = fset.m_ptr;
  if (fset.m_ptr == (PyObject *)0x0) {
    local_78.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
  }
  local_88.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  if (cVar2 == '\0') {
    c = "";
  }
  else {
    c = rec_func->doc;
  }
  str::str((str *)&local_90,c);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_80,local_58,&local_60,(none *)&local_68,
             (str *)&local_88);
  local_48 = (this->super_object).super_handle.m_ptr;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_40 = name;
  accessor_policies::str_attr::set((handle)local_48,name,local_80);
  object::~object(&local_38);
  object::~object((object *)&local_80);
  object::~object(&local_90);
  object::~object(&local_88);
  if (fset.m_ptr == (PyObject *)0x0) {
    object::~object(&local_78);
  }
  if (fget.m_ptr == (PyObject *)0x0) {
    object::~object(&local_70);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget, handle fset,
                                  detail::function_record *rec_func) {
        const auto is_static = rec_func && !(rec_func->is_method && rec_func->scope);
        const auto has_doc = rec_func && rec_func->doc && pybind11::options::show_user_defined_docstrings();
        auto property = handle((PyObject *) (is_static ? get_internals().static_property_type
                                                       : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/none(),
                              pybind11::str(has_doc ? rec_func->doc : ""));
    }